

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

size_t __thiscall
adios2::format::BP4Deserializer::ParseMetadata
          (BP4Deserializer *this,BufferSTL *bufferSTL,Engine *engine,bool firstStep)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  mapped_type *pmVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  byte in_CL;
  long in_RDX;
  unsigned_long *in_RSI;
  long *in_RDI;
  size_t i;
  string item;
  stringstream ss;
  string selectedStepsStr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> selectedSteps;
  iterator itStepsString;
  size_t lastposition;
  size_t allSteps;
  size_t oldSteps;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  mapped_type *in_stack_fffffffffffffce8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffcf0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffcf8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined1 uVar7;
  int in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  BP4Deserializer *in_stack_fffffffffffffd30;
  BP4Deserializer *local_2b8;
  allocator local_291;
  string local_290 [32];
  iterator in_stack_fffffffffffffd90;
  iterator in_stack_fffffffffffffd98;
  iterator in_stack_fffffffffffffda0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffda8;
  BP4Deserializer *this_00;
  string local_240 [32];
  stringstream local_220 [408];
  string local_88 [32];
  _Self local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Self local_48;
  value_type local_40;
  undefined8 local_38;
  BP4Deserializer *local_30;
  BP4Deserializer *local_28;
  byte local_19;
  long local_18;
  unsigned_long *local_10;
  
  local_19 = in_CL & 1;
  if (local_19 == 0) {
    local_2b8 = *(BP4Deserializer **)((long)in_RDI + *(long *)(*in_RDI + -0x20) + 0x1d0);
  }
  else {
    local_2b8 = (BP4Deserializer *)0x0;
  }
  local_28 = local_2b8;
  local_38 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffffce0,(key_type *)in_stack_fffffffffffffcd8);
  local_30 = (BP4Deserializer *)
             std::
             unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::size((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)0xc60971);
  *(BP4Deserializer **)((long)in_RDI + *(long *)(*in_RDI + -0x20) + 0x1d0) = local_30;
  *(undefined1 **)((long)in_RDI + *(long *)(*in_RDI + -0x20) + 0x1d8) = &local_30[-1].field_0x52f;
  local_40 = 0;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffcd8,(key_type *)0xc609e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xc609f5);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffcd8);
  bVar1 = std::operator!=(&local_48,&local_68);
  this_00 = local_28;
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                          (key_type *)in_stack_fffffffffffffd18._M_current);
    std::__cxx11::string::string(local_88,(string *)pmVar3);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_220,local_88,_Var2);
    std::__cxx11::string::string(local_240);
    while( true ) {
      in_stack_fffffffffffffd30 =
           (BP4Deserializer *)
           std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_220,local_240,',');
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&in_stack_fffffffffffffd30->_vptr_BP4Deserializer +
                                (long)in_stack_fffffffffffffd30->_vptr_BP4Deserializer[-3]));
      in_stack_fffffffffffffd2c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd2c);
      if (!bVar1) break;
      in_stack_fffffffffffffd28 =
           std::__cxx11::stoi(in_stack_fffffffffffffce0,(size_t *)in_stack_fffffffffffffcd8,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffce0,
                 (value_type *)in_stack_fffffffffffffcd8);
    }
    std::__cxx11::string::~string(local_240);
    std::__cxx11::stringstream::~stringstream(local_220);
    std::__cxx11::string::~string(local_88);
    this_00 = local_28;
  }
  for (; this_00 < local_30;
      this_00 = (BP4Deserializer *)((long)&this_00->_vptr_BP4Deserializer + 1)) {
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_60);
    uVar7 = true;
    if (sVar4 != 0) {
      in_stack_fffffffffffffd10 = &local_60;
      in_stack_fffffffffffffda0 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd98 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd18 =
           std::
           find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                     (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      (unsigned_long *)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffda8 = in_stack_fffffffffffffd18;
      in_stack_fffffffffffffd90 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffcd8);
      uVar7 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffce0,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffcd8);
    }
    if ((bool)uVar7 != false) {
      pcVar5 = "Fortran";
      if (*(int *)(*(long *)(local_18 + 0x28) + 0x58) == 0) {
        pcVar5 = "C++";
      }
      in_stack_fffffffffffffcf8._M_current = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,pcVar5,&local_291);
      ParsePGIndexPerStep(this_00,(BufferSTL *)in_stack_fffffffffffffda8._M_current,
                          (string *)in_stack_fffffffffffffda0._M_current,
                          (size_t)in_stack_fffffffffffffd98._M_current,
                          (size_t)in_stack_fffffffffffffd90._M_current);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      ParseVariablesIndexPerStep
                (in_stack_fffffffffffffd30,
                 (BufferSTL *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 (Engine *)CONCAT17(uVar7,in_stack_fffffffffffffd20),
                 (size_t)in_stack_fffffffffffffd18._M_current,(size_t)in_stack_fffffffffffffd10);
      ParseAttributesIndexPerStep
                (in_stack_fffffffffffffd30,
                 (BufferSTL *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 (Engine *)CONCAT17(uVar7,in_stack_fffffffffffffd20),
                 (size_t)in_stack_fffffffffffffd18._M_current,(size_t)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffcf0._M_current =
           (unsigned_long *)
           std::
           unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                         *)in_stack_fffffffffffffce0,(key_type *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce8 =
           std::
           unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)in_stack_fffffffffffffce0,(key_type *)in_stack_fffffffffffffcd8);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_fffffffffffffce8,3);
      local_40 = *pvVar6;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffcf0._M_current);
  return local_40;
}

Assistant:

size_t BP4Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine,
                                      const bool firstStep)
{
    const size_t oldSteps = (firstStep ? 0 : m_MetadataSet.StepsCount);
    size_t allSteps = m_MetadataIndexTable[0].size();
    m_MetadataSet.StepsCount = allSteps;
    m_MetadataSet.CurrentStep = allSteps - 1;
    size_t lastposition = 0;
    /* parse the metadata step by step using the pointers saved in the metadata
    index table */
    auto itStepsString = engine.m_IO.m_Parameters.find(engine.m_Name);
    std::vector<size_t> selectedSteps;
    if (itStepsString != engine.m_IO.m_Parameters.end())
    {
        std::string selectedStepsStr = engine.m_IO.m_Parameters[engine.m_Name];
        std::stringstream ss(selectedStepsStr);
        std::string item;

        while (std::getline(ss, item, ','))
        {
            selectedSteps.push_back(std::stoi(item));
        }
    }
    for (size_t i = oldSteps; i < allSteps; i++)
    {
        if (selectedSteps.size() == 0 ||
            std::find(selectedSteps.begin(), selectedSteps.end(), i) != selectedSteps.end())
        {
            ParsePGIndexPerStep(bufferSTL,
                                (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++"
                                                                                      : "Fortran",
                                0, i + 1);
            ParseVariablesIndexPerStep(bufferSTL, engine, 0, i + 1);
            ParseAttributesIndexPerStep(bufferSTL, engine, 0, i + 1);
            lastposition = m_MetadataIndexTable[0][i + 1][3];
        }
    }
    return lastposition;
}